

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

EVP_PKEY * PKCS8_parse_encrypted_private_key(CBS *cbs,char *pass,size_t pass_len)

{
  int iVar1;
  size_t sVar2;
  uint8_t *in;
  EVP_PKEY *pEVar3;
  EVP_PKEY *ret;
  CBS pki;
  size_t out_len;
  uint8_t *out;
  CBS ciphertext;
  CBS algorithm;
  CBS epki;
  size_t pass_len_local;
  char *pass_local;
  CBS *cbs_local;
  
  iVar1 = CBS_get_asn1(cbs,(CBS *)&algorithm.len,0x20000010);
  if ((((iVar1 != 0) &&
       (iVar1 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)&ciphertext.len,0x20000010), iVar1 != 0))
      && (iVar1 = CBS_get_asn1((CBS *)&algorithm.len,(CBS *)&out,4), iVar1 != 0)) &&
     (sVar2 = CBS_len((CBS *)&algorithm.len), sVar2 == 0)) {
    in = CBS_data((CBS *)&out);
    sVar2 = CBS_len((CBS *)&out);
    iVar1 = pkcs8_pbe_decrypt((uint8_t **)&out_len,&pki.len,(CBS *)&ciphertext.len,pass,pass_len,in,
                              sVar2);
    if (iVar1 == 0) {
      return (EVP_PKEY *)0x0;
    }
    CBS_init((CBS *)&ret,(uint8_t *)out_len,pki.len);
    pEVar3 = EVP_parse_private_key((CBS *)&ret);
    OPENSSL_free((void *)out_len);
    return pEVar3;
  }
  ERR_put_error(0x13,0,0x68,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                ,0x17f);
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *PKCS8_parse_encrypted_private_key(CBS *cbs, const char *pass,
                                            size_t pass_len) {
  // See RFC 5208, section 6.
  CBS epki, algorithm, ciphertext;
  if (!CBS_get_asn1(cbs, &epki, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&epki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&epki, &ciphertext, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&epki) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  uint8_t *out;
  size_t out_len;
  if (!pkcs8_pbe_decrypt(&out, &out_len, &algorithm, pass, pass_len,
                         CBS_data(&ciphertext), CBS_len(&ciphertext))) {
    return 0;
  }

  CBS pki;
  CBS_init(&pki, out, out_len);
  EVP_PKEY *ret = EVP_parse_private_key(&pki);
  OPENSSL_free(out);
  return ret;
}